

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::render
          (VertexArrayObjectTest *this,Surface *vaoResult,Surface *defaultResult)

{
  VertexArrayState *state;
  VertexArrayState *state_00;
  RenderContext *pRVar1;
  GLenum GVar2;
  void *pvVar3;
  GLuint vao;
  TextureFormat local_70;
  Surface *local_68;
  GLuint local_5c;
  PixelBufferAccess local_58;
  
  local_5c = 0;
  local_68 = defaultResult;
  glwGenVertexArrays(1,&local_5c);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glGenVertexArrays(1, &vao)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x25a);
  glwBindVertexArray(local_5c);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glBindVertexArray(vao)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x25b);
  state = &(this->m_spec).vao;
  setState(this,state);
  glwBindVertexArray(0);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glBindVertexArray(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x25d);
  state_00 = &(this->m_spec).state;
  setState(this,state_00);
  glwBindVertexArray(local_5c);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glBindVertexArray(vao)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x261);
  glwUseProgram((this->m_vaoProgram->m_program).m_program);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glUseProgram(m_vaoProgram->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x262);
  makeDrawCall(this,state);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_70.order = RGBA;
  local_70.type = UNORM_INT8;
  pvVar3 = (void *)(vaoResult->m_pixels).m_cap;
  if (pvVar3 != (void *)0x0) {
    pvVar3 = (vaoResult->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_70,vaoResult->m_width,vaoResult->m_height,1,pvVar3);
  glu::readPixels(pRVar1,0,0,&local_58);
  setState(this,state);
  glwBindVertexArray(0);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glBindVertexArray(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x266);
  glwUseProgram((this->m_stateProgram->m_program).m_program);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"glUseProgram(m_stateProgram->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                  ,0x268);
  makeDrawCall(this,state_00);
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_70.order = RGBA;
  local_70.type = UNORM_INT8;
  pvVar3 = (void *)(local_68->m_pixels).m_cap;
  if (pvVar3 != (void *)0x0) {
    pvVar3 = (local_68->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_70,local_68->m_width,local_68->m_height,1,pvVar3);
  glu::readPixels(pRVar1,0,0,&local_58);
  return;
}

Assistant:

void VertexArrayObjectTest::render (tcu::Surface& vaoResult, tcu::Surface& defaultResult)
{
	GLuint vao = 0;

	GLU_CHECK_CALL(glGenVertexArrays(1, &vao));
	GLU_CHECK_CALL(glBindVertexArray(vao));
	setState(m_spec.vao);
	GLU_CHECK_CALL(glBindVertexArray(0));

	setState(m_spec.state);

	GLU_CHECK_CALL(glBindVertexArray(vao));
	GLU_CHECK_CALL(glUseProgram(m_vaoProgram->getProgram()));
	makeDrawCall(m_spec.vao);
	glu::readPixels(m_context.getRenderContext(), 0, 0, vaoResult.getAccess());
	setState(m_spec.vao);
	GLU_CHECK_CALL(glBindVertexArray(0));

	GLU_CHECK_CALL(glUseProgram(m_stateProgram->getProgram()));
	makeDrawCall(m_spec.state);
	glu::readPixels(m_context.getRenderContext(), 0, 0, defaultResult.getAccess());
}